

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int order_select(sat_solver2 *s,float random_var_freq)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  double dVar7;
  int local_4c;
  int local_48;
  int child;
  int i;
  uint act;
  int x;
  int size;
  int next_1;
  int next;
  int *orderpos;
  int *heap;
  float random_var_freq_local;
  sat_solver2 *s_local;
  
  piVar6 = veci_begin(&s->order);
  piVar2 = s->orderpos;
  dVar7 = drand(&s->random_seed);
  if (dVar7 < (double)random_var_freq) {
    iVar3 = irand(&s->random_seed,s->size);
    if ((iVar3 < 0) || (s->size <= iVar3)) {
      __assert_fail("next >= 0 && next < s->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x10f,"int order_select(sat_solver2 *, float)");
    }
    iVar4 = var_value(s,iVar3);
    if (iVar4 == 3) {
      return iVar3;
    }
  }
  do {
    iVar3 = veci_size(&s->order);
    if (iVar3 < 1) {
      return -1;
    }
    iVar3 = *piVar6;
    iVar5 = veci_size(&s->order);
    iVar5 = iVar5 + -1;
    iVar4 = piVar6[iVar5];
    veci_resize(&s->order,iVar5);
    piVar2[iVar3] = -1;
    if (0 < iVar5) {
      uVar1 = s->activity[iVar4];
      local_48 = 0;
      for (local_4c = 1; local_4c < iVar5; local_4c = local_4c * 2 + 1) {
        if ((local_4c + 1 < iVar5) &&
           (s->activity[piVar6[local_4c]] < s->activity[piVar6[local_4c + 1]])) {
          local_4c = local_4c + 1;
        }
        if (iVar5 <= local_4c) {
          __assert_fail("child < size",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                        ,0x121,"int order_select(sat_solver2 *, float)");
        }
        if (s->activity[piVar6[local_4c]] <= uVar1) break;
        piVar6[local_48] = piVar6[local_4c];
        piVar2[piVar6[local_48]] = local_48;
        local_48 = local_4c;
      }
      piVar6[local_48] = iVar4;
      piVar2[piVar6[local_48]] = local_48;
    }
    iVar4 = var_value(s,iVar3);
    if (iVar4 == 3) {
      return iVar3;
    }
  } while( true );
}

Assistant:

static inline int  order_select(sat_solver2* s, float random_var_freq) // selectvar
{
    int*      heap     = veci_begin(&s->order);
    int*      orderpos = s->orderpos;
    // Random decision:
    if (drand(&s->random_seed) < random_var_freq){
        int next = irand(&s->random_seed,s->size);
        assert(next >= 0 && next < s->size);
        if (var_value(s, next) == varX)
            return next;
    }
    // Activity based decision:
    while (veci_size(&s->order) > 0){
        int    next  = heap[0];
        int    size  = veci_size(&s->order)-1;
        int    x     = heap[size];
        veci_resize(&s->order,size);
        orderpos[next] = -1;
        if (size > 0){
            unsigned act   = s->activity[x];
            int      i     = 0;
            int      child = 1;
            while (child < size){
                if (child+1 < size && s->activity[heap[child]] < s->activity[heap[child+1]])
                    child++;
                assert(child < size);
                if (act >= s->activity[heap[child]])
                    break;
                heap[i]           = heap[child];
                orderpos[heap[i]] = i;
                i                 = child;
                child             = 2 * child + 1;
            }
            heap[i]           = x;
            orderpos[heap[i]] = i;
        }
        if (var_value(s, next) == varX)
            return next;
    }
    return var_Undef;
}